

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

ImGuiID __thiscall ImGuiWindow::GetIDNoKeepAlive(ImGuiWindow *this,int n)

{
  long lVar1;
  uint uVar2;
  int local_c;
  
  local_c = n;
  lVar1 = (long)(this->IDStack).Size;
  if (0 < lVar1) {
    uVar2 = ~(this->IDStack).Data[lVar1 + -1];
    lVar1 = 0;
    do {
      uVar2 = uVar2 >> 8 ^ GCrc32LookupTable[(uint)*(byte *)((long)&local_c + lVar1) ^ uVar2 & 0xff]
      ;
      lVar1 = lVar1 + 1;
    } while (lVar1 != 4);
    uVar2 = ~uVar2;
    if (GImGui->DebugHookIdInfo == uVar2) {
      ImGui::DebugHookIdInfo(uVar2,4,(void *)(long)n,(void *)0x0);
    }
    return uVar2;
  }
  __assert_fail("Size > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.h"
                ,0x70f,"T &ImVector<unsigned int>::back() [T = unsigned int]");
}

Assistant:

ImGuiID ImGuiWindow::GetIDNoKeepAlive(int n)
{
    ImGuiID seed = IDStack.back();
    ImGuiID id = ImHashData(&n, sizeof(n), seed);
    ImGuiContext& g = *GImGui;
    if (g.DebugHookIdInfo == id)
        ImGui::DebugHookIdInfo(id, ImGuiDataType_S32, (void*)(intptr_t)n, NULL);
    return id;
}